

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_for::run_impl(statement_for *this)

{
  bool bVar1;
  element_type *peVar2;
  bool *pbVar3;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end2;
  iterator __begin2;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2;
  scope_guard scope;
  scope_guard top_scope;
  undefined1 in_stack_000007af;
  iterator *in_stack_000007b0;
  runtime_type *in_stack_000007b8;
  element_type *in_stack_fffffffffffffe68;
  iterator in_stack_fffffffffffffe70;
  statement_base *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  instance_type *in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  
  cs_debugger_step_callback(in_stack_fffffffffffffeb0);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f3eff);
  peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f3f0b);
  if ((peVar2->break_block & 1U) != 0) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f3f22);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f3f2e);
    peVar2->break_block = false;
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f3f43);
  peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f3f4f);
  if ((peVar2->continue_block & 1U) != 0) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f3f66);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f3f72);
    peVar2->continue_block = false;
  }
  scope_guard::scope_guard
            ((scope_guard *)in_stack_fffffffffffffe70.mData,(context_t *)in_stack_fffffffffffffe68);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f3f9e);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1f3faa);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
              *)in_stack_fffffffffffffe70.mData,(size_type)in_stack_fffffffffffffe68);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe68);
  instance_type::parse_define_var
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff97,
             (bool)in_stack_ffffffffffffff96);
  scope_guard::scope_guard
            ((scope_guard *)in_stack_fffffffffffffe70.mData,(context_t *)in_stack_fffffffffffffe68);
  do {
    process_context::poll_event((process_context *)in_stack_fffffffffffffe70.mData);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f4030);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f403c);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                *)in_stack_fffffffffffffe70.mData,(size_type)in_stack_fffffffffffffe68);
    tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe68);
    runtime_type::parse_expr(in_stack_000007b8,in_stack_000007b0,(bool)in_stack_000007af);
    pbVar3 = cs_impl::any::const_val<bool>
                       ((any *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    bVar1 = *pbVar3;
    cs_impl::any::~any((any *)0x1f40bc);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
LAB_001f45a6:
      scope_guard::~scope_guard((scope_guard *)0x1f45b3);
      scope_guard::~scope_guard((scope_guard *)0x1f45c0);
      return;
    }
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffe68);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffe68);
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffe70.mData,
                                   (_Self *)in_stack_fffffffffffffe68), bVar1) {
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator*((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                 *)&stack0xffffffffffffff98);
      statement_base::run((statement_base *)in_stack_fffffffffffffe70.mData);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f4443);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1f444f);
      if ((peVar2->return_fcall & 1U) != 0) goto LAB_001f45a6;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f4476);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1f4482);
      if ((peVar2->break_block & 1U) != 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1f4499);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1f44a5);
        peVar2->break_block = false;
        goto LAB_001f45a6;
      }
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f44ca);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1f44d6);
      if ((peVar2->continue_block & 1U) != 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1f44ed);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1f44f9);
        peVar2->continue_block = false;
        break;
      }
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                  *)in_stack_fffffffffffffe70.mData);
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1f4524);
    in_stack_fffffffffffffe68 =
         std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1f4530);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    operator[]((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                *)in_stack_fffffffffffffe70.mData,(size_type)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe70 =
         tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe68)
    ;
    runtime_type::parse_expr(in_stack_000007b8,in_stack_000007b0,(bool)in_stack_000007af);
    cs_impl::any::~any((any *)0x1f4587);
    scope_guard::clear((scope_guard *)0x1f4594);
  } while( true );
}

Assistant:

void statement_for::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard top_scope(context);
		context->instance->parse_define_var(mParallel[0].root());
		scope_guard scope(context);
		while (true) {
			current_process->poll_event();
			if (!context->instance->parse_expr(mParallel[1].root()).const_val<boolean>())
				break;
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			context->instance->parse_expr(mParallel[2].root());
			scope.clear();
		}
	}